

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O1

void wallet::CKeyMetadata::SerializationOps<DataStream,wallet::CKeyMetadata_const,ActionSerialize>
               (int *obj,DataStream *s)

{
  uint8_t f;
  long in_FS_OFFSET;
  undefined1 local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  SerializeMany<DataStream,int,long>(s,obj,(long *)(obj + 2));
  if (9 < *obj) {
    Serialize<DataStream,char>
              (s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(obj + 4));
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
               (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_finish,obj + 0xc,obj + 0x11);
  }
  if (0xb < *obj) {
    KeyOriginInfo::SerializationOps<DataStream,KeyOriginInfo_const,ActionSerialize>(obj + 0x12,s);
    local_21 = (undefined1)obj[0x1a];
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
               (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_finish,&local_21);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CKeyMetadata, obj)
    {
        READWRITE(obj.nVersion, obj.nCreateTime);
        if (obj.nVersion >= VERSION_WITH_HDDATA) {
            READWRITE(obj.hdKeypath, obj.hd_seed_id);
        }
        if (obj.nVersion >= VERSION_WITH_KEY_ORIGIN)
        {
            READWRITE(obj.key_origin);
            READWRITE(obj.has_key_origin);
        }
    }